

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugutils.cpp
# Opt level: O3

void DebugUtils::dumpToConsole(LEFCellInfo_t *cell)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  stringstream ss;
  string local_1c8;
  stringstream local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  if (cell == (LEFCellInfo_t *)0x0) {
    lVar5 = 0x1a;
    pcVar4 = "Error: cell is a nullptr!\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Name:    ",9);
    pcVar4 = (cell->m_name)._M_dataplus._M_p;
    iVar1 = (int)(ostream *)local_198;
    if (pcVar4 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(local_198[0] + -0x18));
    }
    else {
      sVar2 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar4,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Foreign  ",9);
    pcVar4 = (cell->m_foreign)._M_dataplus._M_p;
    if (pcVar4 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(local_198[0] + -0x18));
    }
    else {
      sVar2 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar4,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Width    ",9);
    poVar3 = std::ostream::_M_insert<double>(cell->m_sx);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Height   ",9);
    poVar3 = std::ostream::_M_insert<double>(cell->m_sy);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Type     ",9);
    pcVar4 = "REGULAR";
    if ((ulong)cell->m_isFiller != 0) {
      pcVar4 = "FILLER";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,pcVar4,(ulong)cell->m_isFiller ^ 7);
    pcVar4 = "\n";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Symmetry ",9);
    __s = (cell->m_symmetry)._M_dataplus._M_p;
    if (__s == (char *)0x0) {
      lVar5 = 1;
      std::ios::clear(iVar1 + (int)*(undefined8 *)(local_198[0] + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      lVar5 = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar4,lVar5);
  std::__cxx11::stringbuf::str();
  doLog(3,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void DebugUtils::dumpToConsole(const PRLEFReader::LEFCellInfo_t *cell)
{
    std::stringstream ss;
    ss << "\n";

    if (cell != nullptr)
    {
        ss << "Name:    " << cell->m_name.c_str() << "\n";
        ss << "Foreign  " << cell->m_foreign.c_str() << "\n";
        ss << "Width    " << cell->m_sx << "\n";
        ss << "Height   " << cell->m_sy << "\n";
        ss << "Type     " << (cell->m_isFiller ? "FILLER" : "REGULAR") << "\n";
        ss << "Symmetry " << cell->m_symmetry.c_str() << "\n";
    }
    else
    {
        ss << "Error: cell is a nullptr!\n";
    }
    doLog(LOG_INFO, ss.str());
}